

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_time.c
# Opt level: O2

int equal_stop_time(stop_time_t *a,stop_time_t *b)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = strcmp(a->trip_id,b->trip_id);
  uVar2 = 0;
  uVar3 = 0;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->arrival_time,b->arrival_time);
    if (iVar1 == 0) {
      iVar1 = strcmp(a->departure_time,b->departure_time);
      if (iVar1 == 0) {
        iVar1 = strcmp(a->stop_id,b->stop_id);
        uVar2 = uVar3;
        if (iVar1 == 0) {
          iVar1 = strcmp(a->stop_headsign,b->stop_headsign);
          if ((((iVar1 == 0) && (a->stop_sequence == b->stop_sequence)) &&
              (a->pickup_type == b->pickup_type)) &&
             (((a->dropoff_type == b->dropoff_type &&
               (a->shape_dist_traveled == b->shape_dist_traveled)) &&
              (!NAN(a->shape_dist_traveled) && !NAN(b->shape_dist_traveled))))) {
            uVar2 = (uint)(a->timepoint == b->timepoint);
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int equal_stop_time(const stop_time_t *a, const stop_time_t *b) {
    return (!strcmp(a->trip_id, b->trip_id) &&
             !strcmp(a->arrival_time, b->arrival_time) &&
             !strcmp(a->departure_time, b->departure_time) &&
             !strcmp(a->stop_id, b->stop_id) &&
             !strcmp(a->stop_headsign, b->stop_headsign) &&
             a->stop_sequence == b->stop_sequence &&
             a->pickup_type == b->pickup_type &&
             a->dropoff_type == b->dropoff_type &&
             a->shape_dist_traveled == b->shape_dist_traveled &&
             a->timepoint == b->timepoint);
}